

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QItemSelection * __thiscall
QListViewPrivate::selection
          (QItemSelection *__return_storage_ptr__,QListViewPrivate *this,QRect *rect)

{
  QWidgetData *pQVar1;
  int *piVar2;
  LayoutDirection LVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  QModelIndex *pQVar7;
  long *plVar8;
  long in_FS_OFFSET;
  bool bVar9;
  int iVar10;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 *local_98;
  QModelIndex local_88;
  QModelIndex local_68;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m.ptr = (QAbstractItemModel *)0x0;
  local_88.r = -1;
  local_88.c = -1;
  local_88.i = 0;
  local_88.m.ptr = (QAbstractItemModel *)0x0;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = 0xaaaaaaaa;
  uStack_a4 = 0xaaaaaaaa;
  uStack_a0 = 0xaaaaaaaa;
  uStack_9c = 0xaaaaaaaa;
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  LVar3 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                       super_QFramePrivate.super_QWidgetPrivate.field_0x8);
  local_48._0_16_ = QRect::normalized();
  uVar4 = local_48._0_8_;
  if (LVar3 == RightToLeft) {
    pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar6 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
    iVar10 = (this->commonListView->contentsSize).wd.m_i;
    if (iVar6 <= iVar10) {
      iVar6 = iVar10;
    }
    uVar5 = ~local_48._8_4_ + iVar6;
    local_48._8_8_ =
         (ulong)((local_48._8_4_ - local_48._0_4_) + uVar5) | local_48._8_8_ & 0xffffffff00000000;
    local_48._0_8_ = (ulong)uVar5 | uVar4 & 0xffffffff00000000;
  }
  (*this->commonListView->_vptr_QCommonListViewBase[7])(&local_a8,this->commonListView,local_48);
  if (local_98 != (undefined1 *)0x0) {
    plVar8 = (long *)CONCAT44(uStack_9c,uStack_a0);
    do {
      if ((((local_68.r < 0) || ((long)local_68._0_8_ < 0)) ||
          (local_68.m.ptr == (QAbstractItemModel *)0x0)) &&
         (((local_88.r < 0 || ((long)local_88._0_8_ < 0)) ||
          (local_88.m.ptr == (QAbstractItemModel *)0x0)))) {
LAB_00579077:
        local_88.m.ptr = (QAbstractItemModel *)plVar8[2];
        local_88._0_8_ = *plVar8;
        local_88.i = plVar8[1];
        local_68.r = (int)*plVar8;
        local_68.c = *(int *)((long)plVar8 + 4);
        iVar10 = (int)plVar8[1];
        iVar6 = *(int *)((long)plVar8 + 0xc);
        local_68.m.ptr = (QAbstractItemModel *)plVar8[2];
LAB_0057909a:
        local_68.i = CONCAT44(iVar6,iVar10);
      }
      else {
        if ((int)*plVar8 == local_68.r + -1) {
          local_68.m.ptr = (QAbstractItemModel *)plVar8[2];
          local_68.r = (int)*plVar8;
          local_68.c = *(int *)((long)plVar8 + 4);
          iVar10 = (int)plVar8[1];
          iVar6 = *(int *)((long)plVar8 + 0xc);
          goto LAB_0057909a;
        }
        if ((int)*plVar8 != local_88.r + 1) {
          QItemSelection::select((QModelIndex *)__return_storage_ptr__,&local_68);
          goto LAB_00579077;
        }
        local_88.m.ptr = (QAbstractItemModel *)plVar8[2];
        local_88._0_8_ = *plVar8;
        local_88.i = plVar8[1];
      }
      plVar8 = plVar8 + 3;
    } while (plVar8 != (long *)((long)local_98 * 0x18 + CONCAT44(uStack_9c,uStack_a0)));
  }
  bVar9 = (local_68.c | local_68.r) < 0;
  if (bVar9) {
LAB_0057910e:
    if (((local_88.r < 0) || ((long)local_88._0_8_ < 0)) ||
       (local_88.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_00579134;
    pQVar7 = &local_88;
  }
  else if (((local_68.m.ptr == (QAbstractItemModel *)0x0) || (local_88.r < 0)) ||
          (((long)local_88._0_8_ < 0 || (local_88.m.ptr == (QAbstractItemModel *)0x0)))) {
    if (bVar9 || local_68.m.ptr == (QAbstractItemModel *)0x0) goto LAB_0057910e;
    pQVar7 = &local_68;
  }
  else {
    pQVar7 = &local_68;
  }
  QItemSelection::select((QModelIndex *)__return_storage_ptr__,pQVar7);
LAB_00579134:
  piVar2 = (int *)CONCAT44(uStack_a4,local_a8);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_a4,local_a8),0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QItemSelection QListViewPrivate::selection(const QRect &rect) const
{
    QItemSelection selection;
    QModelIndex tl, br;
    const QList<QModelIndex> intersectVector = intersectingSet(rect);
    QList<QModelIndex>::const_iterator it = intersectVector.begin();
    for (; it != intersectVector.end(); ++it) {
        if (!tl.isValid() && !br.isValid()) {
            tl = br = *it;
        } else if ((*it).row() == (tl.row() - 1)) {
            tl = *it; // expand current range
        } else if ((*it).row() == (br.row() + 1)) {
            br = (*it); // expand current range
        } else {
            selection.select(tl, br); // select current range
            tl = br = *it; // start new range
        }
    }

    if (tl.isValid() && br.isValid())
        selection.select(tl, br);
    else if (tl.isValid())
        selection.select(tl, tl);
    else if (br.isValid())
        selection.select(br, br);

    return selection;
}